

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

void __thiscall
dgPolyhedra::RefineTriangulation
          (dgPolyhedra *this,HaF64 *vertex,HaI32 stride,dgBigVector *normal,HaI32 perimeterCount,
          dgEdge **perimeter)

{
  undefined8 uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  dgEdge *pdVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  dgMatrix dVar39;
  undefined8 uVar40;
  HaI32 i;
  uint uVar41;
  dgListNode *pdVar42;
  dgMatrix *pdVar43;
  long lVar44;
  long lVar45;
  double dVar46;
  ulong uVar47;
  dgEdge *pdVar48;
  ulong uVar49;
  undefined4 in_register_00000084;
  int iVar50;
  dgEdge *pdVar51;
  HaF64 *pHVar52;
  dgTreeNode *pdVar53;
  dgEdge *pdVar54;
  dgEdge *pdVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar69 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar62 [16];
  undefined1 auVar65 [64];
  undefined1 auVar67 [64];
  float fVar70;
  double dVar71;
  HaF64 HVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  double dVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  float fVar104;
  undefined1 auVar103 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  dgDiagonalEdge key_1;
  dgList<dgDiagonalEdge> dignonals;
  dgDiagonalEdge key;
  HaF64 error;
  dgDiagonalEdge local_168;
  double local_160;
  ulong local_158;
  dgEdge **local_150;
  dgList<dgDiagonalEdge> local_148;
  undefined1 local_128 [16];
  undefined1 auStack_118 [8];
  undefined1 auStack_110 [8];
  undefined1 auStack_108 [8];
  float fStack_100;
  undefined1 auStack_fc [12];
  float fStack_f0;
  float fStack_ec;
  double local_e0;
  HaF64 *local_d8;
  dgPolyhedra *local_d0;
  undefined1 local_c8 [16];
  _func_int **local_b8;
  dgBigVector *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  float fStack_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined1 local_48 [16];
  HaF64 local_38;
  undefined1 auVar66 [64];
  undefined1 auVar68 [64];
  
  local_158 = CONCAT44(in_register_00000084,perimeterCount);
  local_160 = (double)CONCAT44(local_160._4_4_,stride);
  local_148._vptr_dgList = (_func_int **)&PTR__dgList_00b42be8;
  local_148.m_count = 0;
  local_b8 = (_func_int **)&PTR__dgList_00b42be8;
  local_148.m_last = (dgListNode *)0x0;
  local_148.m_first = (dgListNode *)0x0;
  local_150 = perimeter;
  local_d8 = vertex;
  local_d0 = this;
  local_b0 = normal;
  if (0 < perimeterCount) {
    uVar49 = 1;
    do {
      pdVar51 = local_150[uVar49 - 1];
      pdVar55 = local_150[uVar49]->m_prev;
      while (pdVar55 != pdVar51) {
        iVar50 = pdVar55->m_incidentVertex;
        for (pdVar42 = local_148.m_first; pdVar42 != (dgListNode *)0x0; pdVar42 = pdVar42->m_next) {
          iVar4 = (pdVar42->m_info).m_i0;
          iVar5 = (pdVar42->m_info).m_i1;
          if (((iVar4 == iVar50) && (pdVar48 = pdVar55->m_twin, iVar5 == pdVar48->m_incidentVertex))
             || ((iVar5 == iVar50 && (pdVar48 = pdVar55->m_twin, iVar4 == pdVar48->m_incidentVertex)
                 ))) goto LAB_0085da6c;
        }
        local_98._4_4_ = pdVar55->m_twin->m_incidentVertex;
        local_98._0_4_ = iVar50;
        dgList<dgDiagonalEdge>::Append(&local_148,(dgDiagonalEdge *)local_98);
        pdVar48 = pdVar55->m_twin;
LAB_0085da6c:
        pdVar55 = pdVar48->m_prev;
      }
      uVar49 = uVar49 + 1;
    } while (uVar49 != perimeterCount + 1);
  }
  pHVar52 = local_d8;
  dVar46 = (double)(long)local_160._0_4_;
  lVar44 = (long)(*local_150)->m_incidentVertex * (long)dVar46;
  local_160 = (double)local_d8[lVar44 + 2];
  if (((!NAN(local_160)) && ((ulong)ABS(local_160) < 0x7ff0000000000000)) &&
     (!NAN((double)local_d8[lVar44 + 1]))) {
    local_c8 = *(undefined1 (*) [16])(local_d8 + lVar44);
    auVar56._8_4_ = 0xffffffff;
    auVar56._0_8_ = 0x7fffffffffffffff;
    auVar56._12_4_ = 0x7fffffff;
    auVar56 = vpandq_avx512vl(local_c8,auVar56);
    auVar57._8_4_ = 0xffffffff;
    auVar57._0_8_ = 0x7fefffffffffffff;
    auVar57._12_4_ = 0x7fefffff;
    uVar49 = vpcmpgtq_avx512vl(auVar56,auVar57);
    if (((uVar49 & 1) == 0) && ((uVar49 & 3) >> 1 == 0)) {
      pdVar51 = (*local_150)->m_next;
      lVar44 = (long)pdVar51->m_incidentVertex * (long)dVar46;
      dVar71 = (double)local_d8[lVar44 + 2];
      if ((!NAN(dVar71)) &&
         (((ulong)ABS(dVar71) < 0x7ff0000000000000 && (!NAN((double)local_d8[lVar44 + 1]))))) {
        auVar58._8_4_ = 0xffffffff;
        auVar58._0_8_ = 0x7fffffffffffffff;
        auVar58._12_4_ = 0x7fffffff;
        auVar56 = vpandq_avx512vl(*(undefined1 (*) [16])(local_d8 + lVar44),auVar58);
        auVar59._8_4_ = 0xffffffff;
        auVar59._0_8_ = 0x7fefffffffffffff;
        auVar59._12_4_ = 0x7fefffff;
        uVar49 = vpcmpgtq_avx512vl(auVar56,auVar59);
        if (((uVar49 & 1) == 0) && ((uVar49 & 3) >> 1 == 0)) {
          dVar71 = dVar71 - local_160;
          auVar56 = vsubpd_avx(*(undefined1 (*) [16])(local_d8 + lVar44),local_c8);
          auVar60._8_4_ = 0xffffffff;
          auVar60._0_8_ = 0x7fffffffffffffff;
          auVar60._12_4_ = 0x7fffffff;
          auVar57 = vandpd_avx512vl(auVar56,auVar60);
          auVar61._8_4_ = 0xffffffff;
          auVar61._0_8_ = 0x7fefffffffffffff;
          auVar61._12_4_ = 0x7fefffff;
          uVar49 = vpcmpgtq_avx512vl(auVar57,auVar61);
          if ((((uVar49 & 1) != 0) || ((uVar49 & 3) >> 1 != 0)) ||
             (0x7fefffffffffffff < (long)ABS(dVar71))) goto LAB_0085ea90;
          auVar62._0_8_ = auVar56._0_8_ * auVar56._0_8_;
          auVar62._8_8_ = auVar56._8_8_ * auVar56._8_8_;
          auVar82._8_8_ = 0;
          auVar82._0_8_ = dVar71;
          auVar57 = vshufpd_avx(auVar62,auVar62,1);
          auVar57 = vfmadd231sd_fma(auVar57,auVar56,auVar56);
          auVar57 = vfmadd231sd_fma(auVar57,auVar82,auVar82);
          if (auVar57._0_8_ < 9.999999960041972e-13) {
            auVar77._8_8_ = 0x7fffffffffffffff;
            auVar77._0_8_ = 0x7fffffffffffffff;
            auVar83._8_8_ = 0x7fefffffffffffff;
            auVar83._0_8_ = 0x7fefffffffffffff;
            do {
              pdVar51 = pdVar51->m_next;
              lVar44 = (long)pdVar51->m_incidentVertex * (long)dVar46;
              dVar71 = (double)local_d8[lVar44 + 2];
              if (((NAN(dVar71)) || (0x7fefffffffffffff < (ulong)ABS(dVar71))) ||
                 (NAN((double)local_d8[lVar44 + 1]))) goto LAB_0085ea4f;
              auVar56 = vpand_avx(*(undefined1 (*) [16])(local_d8 + lVar44),auVar77);
              uVar49 = vpcmpgtq_avx512vl(auVar56,auVar83);
              if (((uVar49 & 1) != 0) || ((uVar49 & 3) >> 1 != 0)) goto LAB_0085ea4f;
              dVar71 = dVar71 - local_160;
              auVar56 = vsubpd_avx(*(undefined1 (*) [16])(local_d8 + lVar44),local_c8);
              auVar90._8_8_ = 0;
              auVar90._0_8_ = dVar71;
              auVar57 = vandpd_avx(auVar56,auVar77);
              uVar49 = vpcmpgtq_avx512vl(auVar57,auVar83);
              if (((uVar49 & 1) != 0) ||
                 (((uVar49 & 3) >> 1 != 0 || (0x7fefffffffffffff < (long)ABS(dVar71)))))
              goto LAB_0085ea90;
              auVar91._0_8_ = auVar56._0_8_ * auVar56._0_8_;
              auVar91._8_8_ = auVar56._8_8_ * auVar56._8_8_;
              auVar57 = vshufpd_avx(auVar91,auVar91,1);
              auVar57 = vfmadd231sd_fma(auVar57,auVar56,auVar56);
              auVar57 = vfmadd231sd_fma(auVar57,auVar90,auVar90);
            } while (auVar57._0_8_ < 9.999999960041972e-13);
          }
          local_e0 = dVar71;
          local_a8 = auVar56;
          local_48 = auVar57;
          pdVar43 = dgGetIdentityMatrix();
          _local_128 = *pdVar43;
          fVar70 = (float)local_160;
          if ((!NAN(fVar70)) && ((uint)ABS(fVar70) < 0x7f800000)) {
            auVar56 = vcvtpd2ps_avx(local_c8);
            auVar57 = vmovshdup_avx(auVar56);
            if (!NAN(auVar57._0_4_)) {
              auVar8._8_4_ = 0x7fffffff;
              auVar8._0_8_ = 0x7fffffff7fffffff;
              auVar8._12_4_ = 0x7fffffff;
              auVar69 = local_128._32_32_;
              auVar57 = vandps_avx512vl(auVar56,auVar8);
              auVar9._8_4_ = 0x7f7fffff;
              auVar9._0_8_ = 0x7f7fffff7f7fffff;
              auVar9._12_4_ = 0x7f7fffff;
              uVar49 = vpcmpgtd_avx512vl(auVar57,auVar9);
              if (((uVar49 & 1) == 0) && (((uVar49 & 0xf) >> 1 & 1) == 0)) {
                uVar1 = vmovlps_avx(auVar56);
                auStack_fc._4_4_ = (int)uVar1;
                auStack_fc._8_4_ = (int)((ulong)uVar1 >> 0x20);
                fStack_f0 = fVar70;
                fStack_ec = 0.0;
                if (local_48._0_8_ < 0.0) {
                  dVar71 = sqrt(local_48._0_8_);
                }
                else {
                  auVar56 = vsqrtsd_avx(local_48,local_48);
                  dVar71 = auVar56._0_8_;
                }
                dVar39 = _local_128;
                dVar71 = 1.0 / dVar71;
                dVar7 = local_e0 * dVar71;
                auVar78._0_8_ = (double)local_a8._0_8_ * dVar71;
                auVar78._8_8_ = (double)local_a8._8_8_ * dVar71;
                auVar10._8_4_ = 0xffffffff;
                auVar10._0_8_ = 0x7fffffffffffffff;
                auVar10._12_4_ = 0x7fffffff;
                auVar56 = vandpd_avx512vl(auVar78,auVar10);
                auVar11._8_4_ = 0xffffffff;
                auVar11._0_8_ = 0x7fefffffffffffff;
                auVar11._12_4_ = 0x7fefffff;
                uVar49 = vpcmpgtq_avx512vl(auVar56,auVar11);
                if ((((uVar49 & 1) != 0) || ((uVar49 & 3) >> 1 != 0)) ||
                   (0x7fefffffffffffff < (long)ABS(dVar7))) {
LAB_0085ea90:
                  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                                ,0x145,
                                "dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
                }
                auVar73._0_4_ = (float)auVar78._0_8_;
                auVar73._4_12_ = auVar78._4_12_;
                auVar56 = vshufpd_avx(auVar78,auVar78,1);
                auVar79._0_4_ = (float)auVar56._0_8_;
                auVar79._4_12_ = auVar56._4_12_;
                auVar84._0_4_ = (float)dVar7;
                auVar84._4_4_ = (int)((ulong)dVar7 >> 0x20);
                auVar84._8_8_ = 0;
                if ((((uint)ABS(auVar73._0_4_) < 0x7f800000) &&
                    ((uint)ABS(auVar79._0_4_) < 0x7f800000)) &&
                   ((!NAN(auVar79._0_4_) &&
                    (((uint)ABS(auVar84._0_4_) < 0x7f800000 && (!NAN(auVar84._0_4_))))))) {
                  local_128._4_4_ = auVar79._0_4_;
                  local_128._0_4_ = auVar73._0_4_;
                  local_128._8_4_ = auVar84._0_4_;
                  _auStack_118 = dVar39._16_48_;
                  local_128._12_4_ = 0;
                  auVar57 = local_128;
                  auVar3._0_8_ = (local_b0->super_dgTemplateVector<double>).m_x;
                  auVar3._8_8_ = (local_b0->super_dgTemplateVector<double>).m_y;
                  dVar71 = (local_b0->super_dgTemplateVector<double>).m_z;
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = dVar71;
                  auVar99._0_8_ = (double)auVar3._0_8_ * (double)auVar3._0_8_;
                  auVar99._8_8_ = (double)auVar3._8_8_ * (double)auVar3._8_8_;
                  auVar56 = vshufpd_avx(auVar99,auVar99,1);
                  auVar56 = vfmadd231sd_fma(auVar56,auVar3,auVar3);
                  auVar56 = vfmadd231sd_fma(auVar56,auVar95,auVar95);
                  auVar56 = vsqrtsd_avx(auVar56,auVar56);
                  dVar89 = 1.0 / auVar56._0_8_;
                  dVar71 = dVar71 * dVar89;
                  dVar7 = (local_b0->super_dgTemplateVector<double>).m_w;
                  auVar96._8_8_ = dVar7;
                  auVar96._0_8_ = dVar7;
                  auVar96._16_8_ = dVar7;
                  auVar96._24_8_ = dVar7;
                  auVar94._8_8_ = dVar71;
                  auVar94._0_8_ = dVar71;
                  auVar94._16_8_ = dVar71;
                  auVar94._24_8_ = dVar71;
                  auVar94 = vblendpd_avx(ZEXT1632(CONCAT88((double)auVar3._8_8_ * dVar89,
                                                           (double)auVar3._0_8_ * dVar89)),auVar94,4
                                        );
                  auVar94 = vblendpd_avx(auVar94,auVar96,8);
                  auVar38._8_4_ = 0xffffffff;
                  auVar38._0_8_ = 0x7fffffffffffffff;
                  auVar38._12_4_ = 0x7fffffff;
                  auVar38._16_8_ = 0x7fffffffffffffff;
                  auVar38._24_8_ = 0x7fffffffffffffff;
                  auVar63._0_32_ = vandpd_avx512vl(auVar94,auVar38);
                  auVar63._32_32_ = auVar69;
                  auVar69._8_4_ = 0xffffffff;
                  auVar69._0_8_ = 0x7fefffffffffffff;
                  auVar69._12_4_ = 0x7fefffff;
                  auVar69._16_8_ = 0x7fefffffffffffff;
                  auVar69._24_8_ = 0x7fefffffffffffff;
                  uVar49 = vpcmpgtq_avx512vl(auVar63._0_32_,auVar69);
                  if ((uVar49 & 0xf) != 0) goto LAB_0085ea90;
                  auVar56 = vcvtpd2ps_avx(auVar94);
                  auVar12._8_4_ = 0x7fffffff;
                  auVar12._0_8_ = 0x7fffffff7fffffff;
                  auVar12._12_4_ = 0x7fffffff;
                  auVar64._16_48_ = auVar63._16_48_;
                  auVar64._0_16_ = vpandd_avx512vl(auVar56,auVar12);
                  auVar13._8_4_ = 0x7f7fffff;
                  auVar13._0_8_ = 0x7f7fffff7f7fffff;
                  auVar13._12_4_ = 0x7f7fffff;
                  uVar49 = vpcmpgtd_avx512vl(auVar64._0_16_,auVar13);
                  if ((uVar49 & 0xf) == 0) {
                    auVar58 = vmovshdup_avx(auVar56);
                    fVar70 = auVar58._0_4_;
                    if (!NAN(fVar70)) {
                      auVar59 = vshufpd_avx(auVar56,auVar56,1);
                      auVar60 = vshufps_avx(auVar56,auVar56,0xff);
                      fVar98 = auVar59._0_4_;
                      if (!NAN(fVar98) && !NAN(auVar60._0_4_)) {
                        auStack_108._0_4_ = auVar56._0_4_;
                        auStack_108._4_4_ = fVar70;
                        fStack_100 = fVar98;
                        stack0xffffffffffffff08 = dVar39.m_posit.super_dgTemplateVector<float>;
                        auStack_fc._0_4_ = auVar60._0_4_;
                        auVar58 = vfmsub231ss_fma(ZEXT416((uint)(auVar79._0_4_ * fVar98)),auVar58,
                                                  auVar84);
                        auVar59 = vfmsub231ss_fma(ZEXT416((uint)(auVar84._0_4_ * auVar56._0_4_)),
                                                  auVar73,auVar59);
                        auVar60 = vfmsub231ss_fma(ZEXT416((uint)(auVar73._0_4_ * fVar70)),auVar56,
                                                  auVar79);
                        if (((0x7f7fffff < (auVar58._0_4_ & 0x7fffffff)) ||
                            (0x7f7fffff < (auVar59._0_4_ & 0x7fffffff))) ||
                           (0x7f7fffff < (auVar60._0_4_ & 0x7fffffff))) {
                          __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                                        ,0x121,
                                        "dgVector::dgVector(const dgTemplateVector<hacd::HaF32> &)")
                          ;
                        }
                        auVar56 = vinsertps_avx(auVar60,auVar56,0xdc);
                        auVar58 = vinsertps_avx(auVar58,auVar59,0x10);
                        auVar56 = vmovlhps_avx(auVar58,auVar56);
                        auStack_118._0_4_ = auVar56._0_4_;
                        auStack_118._4_4_ = auVar56._4_4_;
                        auStack_110._0_4_ = auVar56._8_4_;
                        auStack_110._4_4_ = auVar56._12_4_;
                        _local_128 = CONCAT1616(_auStack_118,auVar57);
                        local_160 = dVar46;
                        dgMatrix::Inverse((dgMatrix *)local_98,(dgMatrix *)local_128);
                        dVar39 = _local_128;
                        auStack_108._0_4_ = fStack_78;
                        auStack_110._4_4_ = fStack_7c;
                        uVar40 = stack0xfffffffffffffef4;
                        fStack_100 = fStack_70;
                        auStack_108._4_4_ = fStack_74;
                        auStack_fc._4_4_ = fStack_68;
                        auStack_fc._0_4_ = fStack_6c;
                        auStack_110._0_4_ = fStack_80;
                        uVar1 = auStack_110;
                        _local_128 = dVar39._0_28_;
                        _local_128 = CONCAT828(uVar40,_local_128);
                        fStack_ec = dVar39.m_posit.super_dgTemplateVector<float>.m_w;
                        auStack_fc._8_4_ = fStack_64;
                        fStack_f0 = fStack_60;
                        dVar39 = _local_128;
                        auStack_118._0_4_ = local_98._16_4_;
                        auStack_118._4_4_ = local_98._20_4_;
                        local_128._0_4_ = local_98._0_4_;
                        local_128._4_4_ = local_98._4_4_;
                        local_128._8_4_ = local_98._8_4_;
                        local_128._12_4_ = local_98._12_4_;
                        _auStack_108 = dVar39._32_32_;
                        _local_128 = CONCAT824(uVar1,_local_128);
                        fStack_ec = 1.0;
                        if (local_148.m_count != 0) {
                          uVar49 = local_158 & 0xffffffff;
                          iVar50 = local_148.m_count * local_148.m_count;
                          do {
                            pdVar42 = local_148.m_first;
                            iVar4 = ((local_148.m_first)->m_info).m_i0;
                            iVar5 = ((local_148.m_first)->m_info).m_i1;
                            dgList<dgDiagonalEdge>::Unlink(&local_148,local_148.m_first);
                            (*pdVar42->_vptr_dgListNode[1])(pdVar42);
                            pdVar53 = (local_d0->super_dgTree<dgEdge,_long>).m_head;
                            if (pdVar53 != (dgTreeNode *)0x0) {
                              uVar47 = (long)iVar4 << 0x20 | (long)iVar5;
                              do {
                                lVar44 = 8;
                                if ((pdVar53->m_key <= (long)uVar47) &&
                                   (lVar44 = 0x10, (long)uVar47 <= pdVar53->m_key)) {
                                  lVar44 = (long)(pdVar53->m_info).m_incidentVertex *
                                           (long)local_160;
                                  dVar46 = (double)pHVar52[lVar44 + 2];
                                  if (((NAN(dVar46)) || (0x7fefffffffffffff < (ulong)ABS(dVar46)))
                                     || (NAN((double)pHVar52[lVar44 + 1]))) goto LAB_0085ea4f;
                                  auVar56 = *(undefined1 (*) [16])(pHVar52 + lVar44);
                                  auVar14._8_4_ = 0xffffffff;
                                  auVar14._0_8_ = 0x7fffffffffffffff;
                                  auVar14._12_4_ = 0x7fffffff;
                                  auVar66._16_48_ = auVar64._16_48_;
                                  auVar57 = vpandq_avx512vl(auVar56,auVar14);
                                  auVar15._8_4_ = 0xffffffff;
                                  auVar15._0_8_ = 0x7fefffffffffffff;
                                  auVar15._12_4_ = 0x7fefffff;
                                  uVar47 = vpcmpgtq_avx512vl(auVar57,auVar15);
                                  if (((uVar47 & 1) != 0) || ((uVar47 & 3) >> 1 != 0))
                                  goto LAB_0085ea4f;
                                  pdVar51 = (pdVar53->m_info).m_next;
                                  lVar45 = (long)pdVar51->m_incidentVertex * (long)local_160;
                                  dVar71 = (double)pHVar52[lVar45 + 2];
                                  if ((NAN(dVar71)) ||
                                     ((0x7fefffffffffffff < (ulong)ABS(dVar71) ||
                                      (auVar116._8_8_ = 0, auVar116._0_8_ = pHVar52[lVar45 + 1],
                                      auVar57 = vucomisd_avx512f(auVar116),
                                      (ulong)ABS(dVar71) < 0x7ff0000000000000)))) goto LAB_0085ea4f;
                                  auVar58 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                                (pHVar52 + lVar45));
                                  auVar16._8_4_ = 0xffffffff;
                                  auVar16._0_8_ = 0x7fffffffffffffff;
                                  auVar16._12_4_ = 0x7fffffff;
                                  auVar59 = vpandq_avx512vl(auVar58,auVar16);
                                  auVar17._8_4_ = 0xffffffff;
                                  auVar17._0_8_ = 0x7fefffffffffffff;
                                  auVar17._12_4_ = 0x7fefffff;
                                  uVar47 = vpcmpgtq_avx512vl(auVar59,auVar17);
                                  if (((uVar47 & 1) != 0) || ((uVar47 & 3) >> 1 != 0))
                                  goto LAB_0085ea4f;
                                  lVar45 = (long)pdVar51->m_next->m_incidentVertex * (long)local_160
                                  ;
                                  dVar7 = (double)pHVar52[lVar45 + 2];
                                  if (((NAN(dVar7)) || (0x7fefffffffffffff < (ulong)ABS(dVar7))) ||
                                     (dVar89 = (double)pHVar52[lVar45 + 1], NAN(dVar89)))
                                  goto LAB_0085ea4f;
                                  auVar59 = *(undefined1 (*) [16])(pHVar52 + lVar45);
                                  auVar18._8_4_ = 0xffffffff;
                                  auVar18._0_8_ = 0x7fffffffffffffff;
                                  auVar18._12_4_ = 0x7fffffff;
                                  auVar60 = vpandq_avx512vl(auVar59,auVar18);
                                  auVar19._8_4_ = 0xffffffff;
                                  auVar19._0_8_ = 0x7fefffffffffffff;
                                  auVar19._12_4_ = 0x7fefffff;
                                  uVar47 = vpcmpgtq_avx512vl(auVar60,auVar19);
                                  if (((uVar47 & 1) != 0) || ((uVar47 & 3) >> 1 != 0))
                                  goto LAB_0085ea4f;
                                  lVar45 = (long)((pdVar53->m_info).m_twin)->m_prev->
                                                 m_incidentVertex * (long)local_160;
                                  dVar2 = (double)pHVar52[lVar45 + 2];
                                  if ((NAN(dVar2)) ||
                                     ((0x7fefffffffffffff < (ulong)ABS(dVar2) ||
                                      (NAN((double)pHVar52[lVar45 + 1]))))) goto LAB_0085ea4f;
                                  auVar60 = *(undefined1 (*) [16])(pHVar52 + lVar45);
                                  auVar20._8_4_ = 0xffffffff;
                                  auVar20._0_8_ = 0x7fffffffffffffff;
                                  auVar20._12_4_ = 0x7fffffff;
                                  auVar61 = vpandq_avx512vl(auVar60,auVar20);
                                  auVar21._8_4_ = 0xffffffff;
                                  auVar21._0_8_ = 0x7fefffffffffffff;
                                  auVar21._12_4_ = 0x7fefffff;
                                  uVar47 = vpcmpgtq_avx512vl(auVar61,auVar21);
                                  if (((uVar47 & 1) != 0) || ((uVar47 & 3) >> 1 != 0))
                                  goto LAB_0085ea4f;
                                  auVar100._0_4_ = (float)auVar56._0_8_;
                                  auVar100._4_12_ = auVar56._4_12_;
                                  fVar70 = (float)(double)pHVar52[lVar44 + 1];
                                  auVar92._0_4_ = (float)dVar46;
                                  auVar92._4_4_ = (int)((ulong)dVar46 >> 0x20);
                                  auVar92._8_8_ = 0;
                                  if ((((NAN(auVar92._0_4_)) ||
                                       (0x7f7fffff < (uint)ABS(auVar92._0_4_))) || (NAN(fVar70))) ||
                                     ((0x7f7fffff < (uint)ABS(auVar100._0_4_) ||
                                      (0x7f7fffff < (uint)ABS(fVar70))))) goto LAB_0085ea6e;
                                  auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar70 * (float)
                                                  auStack_110._0_4_)),auVar100,
                                                  ZEXT416((uint)local_128._8_4_));
                                  auVar56 = vfmadd231ss_fma(auVar56,auVar92,
                                                            ZEXT416((uint)fStack_100));
                                  fVar98 = fStack_f0 + auVar56._0_4_;
                                  if (!NAN(fVar98)) {
                                    auVar103._8_8_ = 0;
                                    auVar103._0_8_ = auStack_118;
                                    auVar97._8_8_ = 0;
                                    auVar97._0_8_ = local_128._0_8_;
                                    auVar56 = vbroadcastss_avx512vl(auVar100);
                                    auVar101._8_8_ = 0;
                                    auVar101._0_8_ = auStack_108;
                                    auVar93._4_4_ = auVar92._0_4_;
                                    auVar93._0_4_ = auVar92._0_4_;
                                    auVar93._8_4_ = auVar92._0_4_;
                                    auVar93._12_4_ = auVar92._0_4_;
                                    fVar102 = local_128._16_4_;
                                    auVar105._0_4_ = fVar102 * fVar70;
                                    fVar104 = local_128._20_4_;
                                    auVar105._4_4_ = fVar104 * fVar70;
                                    auVar105._8_4_ = fVar70 * 0.0;
                                    auVar105._12_4_ = fVar70 * 0.0;
                                    auVar56 = vfmadd213ps_avx512vl(auVar56,auVar97,auVar105);
                                    auVar106._8_8_ = 0;
                                    auVar106._0_8_ = auStack_fc._4_8_;
                                    auVar56 = vfmadd213ps_avx512vl(auVar93,auVar101,auVar56);
                                    auVar56 = vaddps_avx512vl(auVar106,auVar56);
                                    auVar61 = vmovshdup_avx512vl(auVar56);
                                    if (!NAN(auVar61._0_4_)) {
                                      auVar22._8_4_ = 0x7fffffff;
                                      auVar22._0_8_ = 0x7fffffff7fffffff;
                                      auVar22._12_4_ = 0x7fffffff;
                                      auVar61 = vandps_avx512vl(auVar56,auVar22);
                                      auVar23._8_4_ = 0x7f7fffff;
                                      auVar23._0_8_ = 0x7f7fffff7f7fffff;
                                      auVar23._12_4_ = 0x7f7fffff;
                                      uVar47 = vpcmpgtd_avx512vl(auVar61,auVar23);
                                      if ((((uVar47 & 1) == 0) && (((uVar47 & 0xf) >> 1 & 1) == 0))
                                         && ((uint)ABS(fVar98) < 0x7f800000)) {
                                        auVar61 = vcvtps2pd_avx512vl(auVar56);
                                        auVar24._8_4_ = 0xffffffff;
                                        auVar24._0_8_ = 0x7fffffffffffffff;
                                        auVar24._12_4_ = 0x7fffffff;
                                        auVar62 = vpandq_avx512vl(auVar61,auVar24);
                                        auVar25._8_4_ = 0xffffffff;
                                        auVar25._0_8_ = 0x7fefffffffffffff;
                                        auVar25._12_4_ = 0x7fefffff;
                                        uVar47 = vpcmpgtq_avx512vl(auVar62,auVar25);
                                        if ((((uVar47 & 1) != 0) ||
                                            (vucomiss_avx512f(auVar56), (uVar47 & 1) == 0)) ||
                                           ((uVar47 & 3) >> 1 != 0)) goto LAB_0085eab2;
                                        auVar66._0_16_ = vcvtsd2ss_avx512f(auVar58,auVar58);
                                        auVar65._0_4_ = auVar66._0_4_;
                                        auVar65._4_60_ = auVar66._4_60_;
                                        auVar68._0_16_ = vcvtsd2ss_avx512f(auVar57,auVar57);
                                        auVar68._16_48_ = auVar66._16_48_;
                                        auVar67._0_4_ = auVar68._0_4_;
                                        auVar67._4_60_ = auVar68._4_60_;
                                        auVar114._0_4_ = (float)dVar71;
                                        auVar114._4_4_ = (int)((ulong)dVar71 >> 0x20);
                                        auVar114._8_8_ = 0;
                                        if (((NAN(auVar114._0_4_)) ||
                                            (0x7f7fffff < (uint)ABS(auVar114._0_4_))) ||
                                           ((auVar56 = vucomiss_avx512f(auVar67._0_16_),
                                            0x7f7fffff >= (uint)ABS(auVar114._0_4_) ||
                                            ((0x7f7fffff < (auVar65._0_4_ & 0x7fffffff) ||
                                             (0x7f7fffff < (auVar67._0_4_ & 0x7fffffff)))))))
                                        goto LAB_0085ea6e;
                                        auVar57 = vmulss_avx512f(ZEXT416((uint)auStack_110._0_4_),
                                                                 auVar56);
                                        auVar57 = vfmadd231ss_avx512f(auVar57,auVar65._0_16_,
                                                                      ZEXT416((uint)local_128._8_4_)
                                                                     );
                                        auVar57 = vfmadd231ss_avx512f(auVar57,auVar114,
                                                                      ZEXT416((uint)fStack_100));
                                        auVar57 = vaddss_avx512f(ZEXT416((uint)fStack_f0),auVar57);
                                        uVar41 = auVar57._0_4_ & 0x7fffffff;
                                        vucomiss_avx512f(auVar57);
                                        if ((POPCOUNT(uVar41 + 0x80800000 & 0xff) & 1U) != 0) {
                                          auVar56 = vbroadcastss_avx512vl(auVar56);
                                          auVar57 = vbroadcastss_avx512vl(auVar65._0_16_);
                                          auVar115._4_4_ = auVar114._0_4_;
                                          auVar115._0_4_ = auVar114._0_4_;
                                          auVar115._8_4_ = auVar114._0_4_;
                                          auVar115._12_4_ = auVar114._0_4_;
                                          auVar56 = vmulps_avx512vl(auVar103,auVar56);
                                          auVar56 = vfmadd213ps_avx512vl(auVar57,auVar97,auVar56);
                                          auVar56 = vfmadd213ps_avx512vl(auVar115,auVar101,auVar56);
                                          auVar56 = vaddps_avx512vl(auVar106,auVar56);
                                          auVar57 = vmovshdup_avx512vl(auVar56);
                                          if (!NAN(auVar57._0_4_)) {
                                            auVar26._8_4_ = 0x7fffffff;
                                            auVar26._0_8_ = 0x7fffffff7fffffff;
                                            auVar26._12_4_ = 0x7fffffff;
                                            auVar57 = vandps_avx512vl(auVar56,auVar26);
                                            auVar27._8_4_ = 0x7f7fffff;
                                            auVar27._0_8_ = 0x7f7fffff7f7fffff;
                                            auVar27._12_4_ = 0x7f7fffff;
                                            uVar47 = vpcmpgtd_avx512vl(auVar57,auVar27);
                                            if ((((uVar47 & 1) == 0) &&
                                                (((uVar47 & 0xf) >> 1 & 1) == 0)) &&
                                               (uVar41 < 0x7f800000)) {
                                              auVar57 = vcvtps2pd_avx512vl(auVar56);
                                              auVar28._8_4_ = 0xffffffff;
                                              auVar28._0_8_ = 0x7fffffffffffffff;
                                              auVar28._12_4_ = 0x7fffffff;
                                              auVar58 = vpandq_avx512vl(auVar57,auVar28);
                                              auVar29._8_4_ = 0xffffffff;
                                              auVar29._0_8_ = 0x7fefffffffffffff;
                                              auVar29._12_4_ = 0x7fefffff;
                                              uVar47 = vpcmpgtq_avx512vl(auVar58,auVar29);
                                              if ((((uVar47 & 1) != 0) ||
                                                  (vucomiss_avx512f(auVar56), (uVar47 & 1) == 0)) ||
                                                 ((uVar47 & 3) >> 1 != 0)) goto LAB_0085eab2;
                                              auVar112._0_4_ = (float)auVar59._0_8_;
                                              auVar112._4_12_ = auVar59._4_12_;
                                              auVar109._0_4_ = (float)dVar89;
                                              auVar109._4_4_ = (int)((ulong)dVar89 >> 0x20);
                                              auVar109._8_8_ = 0;
                                              auVar107._0_4_ = (float)dVar7;
                                              auVar107._4_4_ = (int)((ulong)dVar7 >> 0x20);
                                              auVar107._8_8_ = 0;
                                              if (((NAN(auVar107._0_4_)) ||
                                                  (0x7f7fffff < (uint)ABS(auVar107._0_4_))) ||
                                                 ((NAN(auVar109._0_4_) ||
                                                  ((0x7f7fffff < (uint)ABS(auVar112._0_4_) ||
                                                   (0x7f7fffff < (uint)ABS(auVar109._0_4_)))))))
                                              goto LAB_0085ea6e;
                                              auVar56 = vmulss_avx512f(ZEXT416((uint)auStack_110.
                                                                                     _0_4_),auVar109
                                                                      );
                                              auVar56 = vfmadd231ss_avx512f(auVar56,auVar112,
                                                                            ZEXT416((uint)local_128.
                                                                                          _8_4_));
                                              auVar56 = vfmadd231ss_avx512f(auVar56,auVar107,
                                                                            ZEXT416((uint)fStack_100
                                                                                   ));
                                              auVar56 = vaddss_avx512f(ZEXT416((uint)fStack_f0),
                                                                       auVar56);
                                              uVar41 = auVar56._0_4_ & 0x7fffffff;
                                              vucomiss_avx512f(auVar56);
                                              if ((POPCOUNT(uVar41 + 0x80800000 & 0xff) & 1U) != 0)
                                              {
                                                auVar113._4_4_ = auVar112._0_4_;
                                                auVar113._0_4_ = auVar112._0_4_;
                                                auVar113._8_4_ = auVar112._0_4_;
                                                auVar113._12_4_ = auVar112._0_4_;
                                                auVar108._4_4_ = auVar107._0_4_;
                                                auVar108._0_4_ = auVar107._0_4_;
                                                auVar108._8_4_ = auVar107._0_4_;
                                                auVar108._12_4_ = auVar107._0_4_;
                                                auVar110._0_4_ = fVar102 * auVar109._0_4_;
                                                auVar110._4_4_ = fVar104 * auVar109._0_4_;
                                                auVar110._8_4_ = auVar109._0_4_ * 0.0;
                                                auVar110._12_4_ = auVar109._0_4_ * 0.0;
                                                auVar56 = vfmadd213ps_fma(auVar113,auVar97,auVar110)
                                                ;
                                                auVar56 = vfmadd213ps_fma(auVar108,auVar101,auVar56)
                                                ;
                                                auVar111._0_4_ = local_128._48_4_ + auVar56._0_4_;
                                                auVar111._4_4_ = local_128._52_4_ + auVar56._4_4_;
                                                auVar111._8_4_ = auVar56._8_4_ + 0.0;
                                                auVar111._12_4_ = auVar56._12_4_ + 0.0;
                                                auVar56 = vmovshdup_avx(auVar111);
                                                if (!NAN(auVar56._0_4_)) {
                                                  auVar30._8_4_ = 0x7fffffff;
                                                  auVar30._0_8_ = 0x7fffffff7fffffff;
                                                  auVar30._12_4_ = 0x7fffffff;
                                                  auVar56 = vandps_avx512vl(auVar111,auVar30);
                                                  auVar31._8_4_ = 0x7f7fffff;
                                                  auVar31._0_8_ = 0x7f7fffff7f7fffff;
                                                  auVar31._12_4_ = 0x7f7fffff;
                                                  uVar47 = vpcmpgtd_avx512vl(auVar56,auVar31);
                                                  if ((((uVar47 & 1) == 0) &&
                                                      (((uVar47 & 0xf) >> 1 & 1) == 0)) &&
                                                     (uVar41 < 0x7f800000)) {
                                                    auVar56 = vcvtps2pd_avx(auVar111);
                                                    auVar32._8_4_ = 0xffffffff;
                                                    auVar32._0_8_ = 0x7fffffffffffffff;
                                                    auVar32._12_4_ = 0x7fffffff;
                                                    auVar58 = vpandq_avx512vl(auVar56,auVar32);
                                                    auVar33._8_4_ = 0xffffffff;
                                                    auVar33._0_8_ = 0x7fefffffffffffff;
                                                    auVar33._12_4_ = 0x7fefffff;
                                                    uVar47 = vpcmpgtq_avx512vl(auVar58,auVar33);
                                                    if ((((uVar47 & 1) != 0) ||
                                                        (NAN(auVar111._0_4_))) ||
                                                       ((uVar47 & 3) >> 1 != 0)) {
LAB_0085eab2:
                                                      __assert_fail(
                                                  "((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                                                  ,0x13f,
                                                  "dgBigVector::dgBigVector(const dgVector &)");
                                                  }
                                                  auVar85._0_4_ = (float)auVar60._0_8_;
                                                  auVar85._4_12_ = auVar60._4_12_;
                                                  fVar70 = (float)(double)pHVar52[lVar45 + 1];
                                                  auVar74._0_4_ = (float)dVar2;
                                                  auVar74._4_4_ = (int)((ulong)dVar2 >> 0x20);
                                                  auVar74._8_8_ = 0;
                                                  if (((NAN(auVar74._0_4_)) ||
                                                      (0x7f7fffff < (uint)ABS(auVar74._0_4_))) ||
                                                     ((NAN(fVar70) ||
                                                      ((0x7f7fffff < (uint)ABS(auVar85._0_4_) ||
                                                       (0x7f7fffff < (uint)ABS(fVar70)))))))
                                                  goto LAB_0085ea6e;
                                                  auVar58 = vfmadd213ss_fma(ZEXT416((uint)local_128.
                                                                                          _8_4_),
                                                                            auVar85,ZEXT416((uint)((
                                                  float)auStack_110._0_4_ * fVar70)));
                                                  auVar58 = vfmadd213ss_fma(ZEXT416((uint)fStack_100
                                                                                   ),auVar74,auVar58
                                                                           );
                                                  fVar98 = fStack_f0 + auVar58._0_4_;
                                                  if (!NAN(fVar98)) {
                                                    auVar86._4_4_ = auVar85._0_4_;
                                                    auVar86._0_4_ = auVar85._0_4_;
                                                    auVar86._8_4_ = auVar85._0_4_;
                                                    auVar86._12_4_ = auVar85._0_4_;
                                                    auVar75._4_4_ = auVar74._0_4_;
                                                    auVar75._0_4_ = auVar74._0_4_;
                                                    auVar75._8_4_ = auVar74._0_4_;
                                                    auVar75._12_4_ = auVar74._0_4_;
                                                    auVar80._0_4_ = fVar102 * fVar70;
                                                    auVar80._4_4_ = fVar104 * fVar70;
                                                    auVar80._8_4_ = fVar70 * 0.0;
                                                    auVar80._12_4_ = fVar70 * 0.0;
                                                    auVar58 = vfmadd213ps_fma(auVar97,auVar86,
                                                                              auVar80);
                                                    auVar58 = vfmadd213ps_fma(auVar101,auVar75,
                                                                              auVar58);
                                                    auVar76._0_4_ = local_128._48_4_ + auVar58._0_4_
                                                    ;
                                                    auVar76._4_4_ = local_128._52_4_ + auVar58._4_4_
                                                    ;
                                                    auVar76._8_4_ = auVar58._8_4_ + 0.0;
                                                    auVar76._12_4_ = auVar58._12_4_ + 0.0;
                                                    auVar58 = vmovshdup_avx(auVar76);
                                                    if (!NAN(auVar58._0_4_)) {
                                                      auVar34._8_4_ = 0x7fffffff;
                                                      auVar34._0_8_ = 0x7fffffff7fffffff;
                                                      auVar34._12_4_ = 0x7fffffff;
                                                      auVar58 = vandps_avx512vl(auVar76,auVar34);
                                                      auVar35._8_4_ = 0x7f7fffff;
                                                      auVar35._0_8_ = 0x7f7fffff7f7fffff;
                                                      auVar35._12_4_ = 0x7f7fffff;
                                                      uVar47 = vpcmpgtd_avx512vl(auVar58,auVar35);
                                                      if ((((uVar47 & 1) == 0) &&
                                                          (((uVar47 & 0xf) >> 1 & 1) == 0)) &&
                                                         ((uint)ABS(fVar98) < 0x7f800000)) {
                                                        auVar58 = vcvtps2pd_avx(auVar76);
                                                        auVar36._8_4_ = 0xffffffff;
                                                        auVar36._0_8_ = 0x7fffffffffffffff;
                                                        auVar36._12_4_ = 0x7fffffff;
                                                        auVar64._0_16_ =
                                                             vpandq_avx512vl(auVar58,auVar36);
                                                        auVar64._16_48_ = auVar66._16_48_;
                                                        auVar37._8_4_ = 0xffffffff;
                                                        auVar37._0_8_ = 0x7fefffffffffffff;
                                                        auVar37._12_4_ = 0x7fefffff;
                                                        uVar47 = vpcmpgtq_avx512vl(auVar64._0_16_,
                                                                                   auVar37);
                                                        if ((((uVar47 & 1) != 0) ||
                                                            (NAN(auVar76._0_4_))) ||
                                                           ((uVar47 & 3) >> 1 != 0))
                                                        goto LAB_0085eab2;
                                                        local_98._0_16_ =
                                                             vsubpd_avx(auVar61,auVar58);
                                                        auVar87._0_8_ =
                                                             local_98._0_8_ * local_98._0_8_;
                                                        auVar87._8_8_ =
                                                             local_98._8_8_ * local_98._8_8_;
                                                        auVar59 = vshufpd_avx(auVar87,auVar87,1);
                                                        auVar60 = vfmadd231sd_fma(auVar59,local_98.
                                                  _0_16_,local_98._0_16_);
                                                  auVar59 = vsubpd_avx(auVar57,auVar58);
                                                  local_98._16_8_ = auVar60._0_8_;
                                                  auVar88._0_8_ = auVar59._0_8_ * auVar59._0_8_;
                                                  auVar88._8_8_ = auVar59._8_8_ * auVar59._8_8_;
                                                  fStack_80 = auVar59._0_4_;
                                                  fStack_7c = auVar59._4_4_;
                                                  fStack_78 = auVar59._8_4_;
                                                  fStack_74 = auVar59._12_4_;
                                                  auVar57 = vshufpd_avx(auVar88,auVar88,1);
                                                  auVar59 = vfmadd231sd_fma(auVar57,auVar59,auVar59)
                                                  ;
                                                  auVar57 = vsubpd_avx(auVar56,auVar58);
                                                  auVar81._0_8_ = auVar57._0_8_ * auVar57._0_8_;
                                                  auVar81._8_8_ = auVar57._8_8_ * auVar57._8_8_;
                                                  fStack_70 = auVar59._0_4_;
                                                  fStack_6c = auVar59._4_4_;
                                                  fStack_68 = auVar57._0_4_;
                                                  _fStack_64 = auVar57._4_8_;
                                                  fStack_5c = auVar57._12_4_;
                                                  auVar56 = vshufpd_avx(auVar81,auVar81,1);
                                                  auVar56 = vfmadd231sd_fma(auVar56,auVar57,auVar57)
                                                  ;
                                                  local_58 = auVar56._0_8_;
                                                  HVar72 = Determinant3x3((HaF64 (*) [3])local_98,
                                                                          &local_38);
                                                  pHVar52 = local_d8;
                                                  if ((double)HVar72 < 0.0) {
                                                    pdVar51 = (pdVar53->m_info).m_prev;
                                                    pdVar55 = ((pdVar53->m_info).m_twin)->m_prev;
                                                    FlipEdge(local_d0,&pdVar53->m_info);
                                                    pHVar52 = local_d8;
                                                    if (4 < (int)local_158) {
                                                      pdVar48 = pdVar55->m_next;
                                                      pdVar54 = pdVar51->m_next;
                                                      uVar47 = 0;
                                                      do {
                                                        pdVar6 = local_150[uVar47];
                                                        if (pdVar51 == pdVar6) {
                                                          pdVar51 = (dgEdge *)0x0;
                                                        }
                                                        if (pdVar54 == pdVar6) {
                                                          pdVar54 = (dgEdge *)0x0;
                                                        }
                                                        if (pdVar55 == pdVar6) {
                                                          pdVar55 = (dgEdge *)0x0;
                                                        }
                                                        if (pdVar48 == pdVar6) {
                                                          pdVar48 = (dgEdge *)0x0;
                                                        }
                                                        uVar47 = uVar47 + 1;
                                                      } while (uVar49 != uVar47);
                                                      if (((pdVar55 != (dgEdge *)0x0) &&
                                                          (0 < pdVar55->m_incidentFace)) &&
                                                         (0 < pdVar55->m_twin->m_incidentFace)) {
                                                        local_168.m_i0 = pdVar55->m_incidentVertex;
                                                        local_168.m_i1 =
                                                             pdVar55->m_twin->m_incidentVertex;
                                                        dgList<dgDiagonalEdge>::Append
                                                                  (&local_148,&local_168);
                                                      }
                                                      if (((pdVar48 != (dgEdge *)0x0) &&
                                                          (0 < pdVar48->m_incidentFace)) &&
                                                         (0 < pdVar48->m_twin->m_incidentFace)) {
                                                        local_168.m_i0 = pdVar48->m_incidentVertex;
                                                        local_168.m_i1 =
                                                             pdVar48->m_twin->m_incidentVertex;
                                                        dgList<dgDiagonalEdge>::Append
                                                                  (&local_148,&local_168);
                                                      }
                                                      if (((pdVar51 != (dgEdge *)0x0) &&
                                                          (0 < pdVar51->m_incidentFace)) &&
                                                         (0 < pdVar51->m_twin->m_incidentFace)) {
                                                        local_168.m_i0 = pdVar51->m_incidentVertex;
                                                        local_168.m_i1 =
                                                             pdVar51->m_twin->m_incidentVertex;
                                                        dgList<dgDiagonalEdge>::Append
                                                                  (&local_148,&local_168);
                                                      }
                                                      pHVar52 = local_d8;
                                                      if (((pdVar54 != (dgEdge *)0x0) &&
                                                          (0 < pdVar54->m_incidentFace)) &&
                                                         (0 < pdVar54->m_twin->m_incidentFace)) {
                                                        local_168.m_i0 = pdVar54->m_incidentVertex;
                                                        local_168.m_i1 =
                                                             pdVar54->m_twin->m_incidentVertex;
                                                        dgList<dgDiagonalEdge>::Append
                                                                  (&local_148,&local_168);
                                                        pHVar52 = local_d8;
                                                      }
                                                    }
                                                  }
                                                  break;
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                                                ,0x134,
                                                "dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)"
                                               );
                                }
                                pdVar53 = *(dgTreeNode **)
                                           ((long)&(pdVar53->super_dgRedBackNode).
                                                   _vptr_dgRedBackNode + lVar44);
                              } while (pdVar53 != (dgTreeNode *)0x0);
                            }
                          } while ((local_148.m_count != 0) && (iVar50 = iVar50 + -1, iVar50 != 0));
                        }
                        local_148._vptr_dgList = local_b8;
                        dgList<dgDiagonalEdge>::RemoveAll(&local_148);
                        return;
                      }
                    }
                  }
                }
              }
            }
          }
LAB_0085ea6e:
          __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                        ,0x12d,"dgVector::dgVector(const dgBigVector &)");
        }
      }
    }
  }
LAB_0085ea4f:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x159,
                "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)");
}

Assistant:

void dgPolyhedra::RefineTriangulation (const hacd::HaF64* const vertex, hacd::HaI32 stride, dgBigVector* const normal, hacd::HaI32 perimeterCount, dgEdge** const perimeter)
{
	dgList<dgDiagonalEdge> dignonals;

	for (hacd::HaI32 i = 1; i <= perimeterCount; i ++) {
		dgEdge* const last = perimeter[i - 1];
		for (dgEdge* ptr = perimeter[i]->m_prev; ptr != last; ptr = ptr->m_twin->m_prev) {
			dgList<dgDiagonalEdge>::dgListNode* node = dignonals.GetFirst();
			for (; node; node = node->GetNext()) {
				const dgDiagonalEdge& key = node->GetInfo();
				if (((key.m_i0 == ptr->m_incidentVertex) && (key.m_i1 == ptr->m_twin->m_incidentVertex)) ||
					((key.m_i1 == ptr->m_incidentVertex) && (key.m_i0 == ptr->m_twin->m_incidentVertex))) {
						break;
				}
			}
			if (!node) {
				dgDiagonalEdge key (ptr);
				dignonals.Append(key);
			}
		}
	}

	dgEdge* const face = perimeter[0];
	hacd::HaI32 i0 = face->m_incidentVertex * stride;
	hacd::HaI32 i1 = face->m_next->m_incidentVertex * stride;
	dgBigVector p0 (vertex[i0], vertex[i0 + 1], vertex[i0 + 2], hacd::HaF32 (0.0f));
	dgBigVector p1 (vertex[i1], vertex[i1 + 1], vertex[i1 + 2], hacd::HaF32 (0.0f));

	dgBigVector p1p0 (p1 - p0);
	hacd::HaF64 mag2 = p1p0 % p1p0;
	for (dgEdge* ptr = face->m_next->m_next; mag2 < hacd::HaF32 (1.0e-12f); ptr = ptr->m_next) {
		hacd::HaI32 i1 = ptr->m_incidentVertex * stride;
		dgBigVector p1 (vertex[i1], vertex[i1 + 1], vertex[i1 + 2], hacd::HaF32 (0.0f));
		p1p0 = p1 - p0;
		mag2 = p1p0 % p1p0;
	}

	dgMatrix matrix (dgGetIdentityMatrix());
	matrix.m_posit = p0;
	matrix.m_front = dgVector (p1p0.Scale (hacd::HaF64 (1.0f) / sqrt (mag2)));
	matrix.m_right = dgVector (normal->Scale (hacd::HaF64 (1.0f) / sqrt (*normal % *normal)));
	matrix.m_up = matrix.m_right * matrix.m_front;
	matrix = matrix.Inverse();
	matrix.m_posit.m_w = hacd::HaF32 (1.0f);

	hacd::HaI32 maxCount = dignonals.GetCount() * dignonals.GetCount();
	while (dignonals.GetCount() && maxCount) {
		maxCount --;
		dgList<dgDiagonalEdge>::dgListNode* const node = dignonals.GetFirst();
		dgDiagonalEdge key (node->GetInfo());
		dignonals.Remove(node);
		dgEdge* const edge = FindEdge(key.m_i0, key.m_i1);
		if (edge) {
			hacd::HaI32 i0 = edge->m_incidentVertex * stride;
			hacd::HaI32 i1 = edge->m_next->m_incidentVertex * stride;
			hacd::HaI32 i2 = edge->m_next->m_next->m_incidentVertex * stride;
			hacd::HaI32 i3 = edge->m_twin->m_prev->m_incidentVertex * stride;

			dgBigVector p0 (vertex[i0], vertex[i0 + 1], vertex[i0 + 2], hacd::HaF64 (0.0f));
			dgBigVector p1 (vertex[i1], vertex[i1 + 1], vertex[i1 + 2], hacd::HaF64 (0.0f));
			dgBigVector p2 (vertex[i2], vertex[i2 + 1], vertex[i2 + 2], hacd::HaF64 (0.0f));
			dgBigVector p3 (vertex[i3], vertex[i3 + 1], vertex[i3 + 2], hacd::HaF64 (0.0f));

			p0 = matrix.TransformVector(p0);
			p1 = matrix.TransformVector(p1);
			p2 = matrix.TransformVector(p2);
			p3 = matrix.TransformVector(p3);

			hacd::HaF64 circleTest[3][3];
			circleTest[0][0] = p0[0] - p3[0];
			circleTest[0][1] = p0[1] - p3[1];
			circleTest[0][2] = circleTest[0][0] * circleTest[0][0] + circleTest[0][1] * circleTest[0][1];

			circleTest[1][0] = p1[0] - p3[0];
			circleTest[1][1] = p1[1] - p3[1];
			circleTest[1][2] = circleTest[1][0] * circleTest[1][0] + circleTest[1][1] * circleTest[1][1];

			circleTest[2][0] = p2[0] - p3[0];
			circleTest[2][1] = p2[1] - p3[1];
			circleTest[2][2] = circleTest[2][0] * circleTest[2][0] + circleTest[2][1] * circleTest[2][1];

			hacd::HaF64 error;
			hacd::HaF64 det = Determinant3x3 (circleTest, &error);
			if (det < hacd::HaF32 (0.0f)) {
				dgEdge* frontFace0 = edge->m_prev;
				dgEdge* backFace0 = edge->m_twin->m_prev;

				FlipEdge(edge);

				if (perimeterCount > 4) {
					dgEdge* backFace1 = backFace0->m_next;
					dgEdge* frontFace1 = frontFace0->m_next;
					for (hacd::HaI32 i = 0; i < perimeterCount; i ++) {
						if (frontFace0 == perimeter[i]) {
							frontFace0 = NULL;
						}
						if (frontFace1 == perimeter[i]) {
							frontFace1 = NULL;
						}

						if (backFace0 == perimeter[i]) {
							backFace0 = NULL;
						}
						if (backFace1 == perimeter[i]) {
							backFace1 = NULL;
						}
					}

					if (backFace0 && (backFace0->m_incidentFace > 0) && (backFace0->m_twin->m_incidentFace > 0)) {
						dgDiagonalEdge key (backFace0);
						dignonals.Append(key);
					}
					if (backFace1 && (backFace1->m_incidentFace > 0) && (backFace1->m_twin->m_incidentFace > 0)) {
						dgDiagonalEdge key (backFace1);
						dignonals.Append(key);
					}

					if (frontFace0 && (frontFace0->m_incidentFace > 0) && (frontFace0->m_twin->m_incidentFace > 0)) {
						dgDiagonalEdge key (frontFace0);
						dignonals.Append(key);
					}

					if (frontFace1 && (frontFace1->m_incidentFace > 0) && (frontFace1->m_twin->m_incidentFace > 0)) {
						dgDiagonalEdge key (frontFace1);
						dignonals.Append(key);
					}
				}
			}
		}
	}
}